

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

ParseableFunctionInfo * __thiscall Js::FunctionProxy::EnsureDeserialized(FunctionProxy *this)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  FunctionBody *pFVar6;
  
  pFVar5 = (this->functionInfo).ptr;
  if ((pFVar5->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x81a,"(this == this->GetFunctionInfo()->GetFunctionProxy())",
                                "this == this->GetFunctionInfo()->GetFunctionProxy()");
    if (!bVar2) goto LAB_0075f15f;
    *puVar4 = 0;
    pFVar5 = (this->functionInfo).ptr;
    if (pFVar5 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x530,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_0075f15f;
      *puVar4 = 0;
      pFVar5 = (this->functionInfo).ptr;
    }
  }
  if ((pFVar5->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x531,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_0075f15f;
    *puVar4 = 0;
    pFVar5 = (this->functionInfo).ptr;
  }
  if ((pFVar5->attributes & DeferredDeserialize) != None) {
    iVar3 = (*(this->m_scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
    if ((char)iVar3 != '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x821,"(!m_scriptContext->IsClosed())",
                                  "!m_scriptContext->IsClosed()");
      if (!bVar2) goto LAB_0075f15f;
      *puVar4 = 0;
    }
    pFVar6 = DeferDeserializeFunctionInfo::Deserialize((DeferDeserializeFunctionInfo *)this);
    pFVar5 = (this->functionInfo).ptr;
    addr = &pFVar5->functionBodyImpl;
    Memory::Recycler::WBSetBit((char *)addr);
    (pFVar5->functionBodyImpl).ptr = (FunctionProxy *)pFVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if ((((pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr == (FunctionProxy *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x825,"(executionFunctionBody->GetFunctionInfo()->HasBody())",
                                  "executionFunctionBody->GetFunctionInfo()->HasBody()");
      if (!bVar2) goto LAB_0075f15f;
      *puVar4 = 0;
    }
    bVar2 = pFVar6 == (FunctionBody *)this;
    this = (FunctionProxy *)pFVar6;
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x826,"(executionFunctionBody != this)",
                                  "executionFunctionBody != this");
      if (!bVar2) {
LAB_0075f15f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return &((FunctionBody *)this)->super_ParseableFunctionInfo;
}

Assistant:

ParseableFunctionInfo * FunctionProxy::EnsureDeserialized()
    {
        Assert(this == this->GetFunctionInfo()->GetFunctionProxy());
        FunctionProxy * executionFunctionBody = this;

        if (IsDeferredDeserializeFunction())
        {
            // No need to deserialize function body if scriptContext closed because we can't execute it.
            // Bigger problem is the script engine might have released bytecode file mapping and we can't deserialize.
            Assert(!m_scriptContext->IsClosed());

            executionFunctionBody = ((DeferDeserializeFunctionInfo*) this)->Deserialize();
            this->GetFunctionInfo()->SetFunctionProxy(executionFunctionBody);
            Assert(executionFunctionBody->GetFunctionInfo()->HasBody());
            Assert(executionFunctionBody != this);
        }

        return (ParseableFunctionInfo *)executionFunctionBody;
    }